

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::PlayBounceSound(AActor *this,bool onfloor)

{
  unsigned_short uVar1;
  int iVar2;
  bool bVar3;
  FSoundID local_24;
  FSoundID local_20;
  FSoundID local_1c;
  TFlags<ActorBounceFlag,_unsigned_short> local_18;
  TFlags<ActorBounceFlag,_unsigned_short> local_16;
  TFlags<ActorBounceFlag,_unsigned_short> local_14;
  byte local_11;
  AActor *pAStack_10;
  bool onfloor_local;
  AActor *this_local;
  
  bVar3 = false;
  iVar2 = (int)this;
  local_11 = onfloor;
  pAStack_10 = this;
  if (!onfloor) {
    TFlags<ActorBounceFlag,_unsigned_short>::operator&
              (&local_14,
               iVar2 + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                       BOUNCE_Actors));
    uVar1 = ::TFlags::operator_cast_to_unsigned_short((TFlags *)&local_14);
    bVar3 = uVar1 != 0;
  }
  if (!bVar3) {
    TFlags<ActorBounceFlag,_unsigned_short>::operator&
              (&local_16,
               iVar2 + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                       BOUNCE_Actors));
    uVar1 = ::TFlags::operator_cast_to_unsigned_short((TFlags *)&local_16);
    if (uVar1 == 0) {
      TFlags<ActorBounceFlag,_unsigned_short>::operator&
                (&local_18,
                 iVar2 + (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                         BOUNCE_Actors));
      uVar1 = ::TFlags::operator_cast_to_unsigned_short((TFlags *)&local_18);
      if (uVar1 == 0) {
        if (((local_11 & 1) == 0) &&
           (iVar2 = FSoundID::operator_cast_to_int(&(this->WallBounceSound).super_FSoundID),
           0 < iVar2)) {
          FSoundID::FSoundID(&local_24,&(this->WallBounceSound).super_FSoundID);
          S_Sound(this,2,&local_24,1.0,1.001);
        }
        else {
          FSoundID::FSoundID(&local_20,&(this->BounceSound).super_FSoundID);
          S_Sound(this,2,&local_20,1.0,1.001);
        }
      }
      else {
        FSoundID::FSoundID(&local_1c,&(this->SeeSound).super_FSoundID);
        S_Sound(this,2,&local_1c,1.0,1.001);
      }
    }
  }
  return;
}

Assistant:

void AActor::PlayBounceSound(bool onfloor)
{
	if (!onfloor && (BounceFlags & BOUNCE_NoWallSound))
	{
		return;
	}

	if (!(BounceFlags & BOUNCE_Quiet))
	{
		if (BounceFlags & BOUNCE_UseSeeSound)
		{
			S_Sound (this, CHAN_VOICE, SeeSound, 1, ATTN_IDLE);
		}
		else if (onfloor || WallBounceSound <= 0)
		{
			S_Sound (this, CHAN_VOICE, BounceSound, 1, ATTN_IDLE);
		}
		else
		{
			S_Sound (this, CHAN_VOICE, WallBounceSound, 1, ATTN_IDLE);
		}
	}
}